

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  string *in_RDI;
  GroupInfo *in_stack_ffffffffffffff68;
  allocator *paVar1;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_ffffffffffffff70;
  XmlFormatting fmt;
  XmlWriter *this_00;
  allocator local_69;
  string local_68 [40];
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  XmlWriter *in_stack_ffffffffffffffd0;
  
  StreamingReporterBase<Catch::XmlReporter>::testGroupStarting
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  fmt = (XmlFormatting)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  this_00 = (XmlWriter *)&in_RDI[0xb].field_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"Group",(allocator *)&stack0xffffffffffffffcf);
  operator|(Newline,Indent);
  XmlWriter::startElement(this_00,in_RDI,fmt);
  paVar1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"name",paVar1);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return;
}

Assistant:

void XmlReporter::testGroupStarting( GroupInfo const& groupInfo ) {
        StreamingReporterBase::testGroupStarting( groupInfo );
        m_xml.startElement( "Group" )
            .writeAttribute( "name", groupInfo.name );
    }